

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMYSQLResultPrivate::QMyField>::appendInitialize
          (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *this,qsizetype newSize)

{
  QMyField *pQVar1;
  QMetaTypeInterface *in_RSI;
  QMyField *in_RDI;
  QMyField *e;
  QMyField *b;
  
  begin((QArrayDataPointer<QMYSQLResultPrivate::QMyField> *)0x11a920);
  pQVar1 = begin((QArrayDataPointer<QMYSQLResultPrivate::QMyField> *)0x11a936);
  std::uninitialized_value_construct<QMYSQLResultPrivate::QMyField*>(pQVar1 + (long)in_RSI,in_RDI);
  (in_RDI->type).d_ptr = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }